

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Value * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::operator[](InnerMap *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  KeyValuePair kv;
  KeyValuePair local_60;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_bool>
  local_38;
  
  paVar1 = &local_60.k_.field_2;
  pcVar2 = (k->_M_dataplus)._M_p;
  local_60.k_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar2,pcVar2 + k->_M_string_length)
  ;
  local_60.v_ = (value_type *)0x0;
  insert(&local_38,this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.k_._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.k_._M_dataplus._M_p,local_60.k_.field_2._M_allocated_capacity + 1);
  }
  return &((local_38.first.node_)->kv).v_;
}

Assistant:

Value& operator[](const Key& k) {
      KeyValuePair kv(k, Value());
      return insert(kv).first->value();
    }